

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGhsMultiGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGhsMultiGenerator::ComputeObjectFilenames
          (cmLocalGhsMultiGenerator *this,
          map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *mapping,cmGeneratorTarget *gt)

{
  int iVar1;
  bool bVar2;
  string *psVar3;
  reference ppVar4;
  mapped_type *pmVar5;
  string local_228;
  bool local_201;
  undefined1 local_200 [7];
  bool keptSourceExtension;
  string local_1e0;
  string local_1c0;
  undefined1 local_1a0 [8];
  string objectName;
  cmSourceFile *sf_1;
  pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *si_1;
  iterator __end1_1;
  iterator __begin1_1;
  map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1_1;
  string local_138;
  string local_118;
  undefined1 local_f8 [8];
  string objectNameLower;
  cmSourceFile *sf;
  pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *si;
  iterator __end1;
  iterator __begin1;
  map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  counts;
  char local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  char local_41;
  undefined1 local_40 [8];
  string dir_max;
  cmGeneratorTarget *gt_local;
  map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *mapping_local;
  cmLocalGhsMultiGenerator *this_local;
  
  dir_max.field_2._8_8_ = gt;
  psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(&this->super_cmLocalGenerator);
  local_41 = '/';
  (*(this->super_cmLocalGenerator).super_cmOutputConverter._vptr_cmOutputConverter[0x10])
            (&local_68,this,dir_max.field_2._8_8_);
  local_69 = '/';
  cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string,char>
            ((string *)local_40,psVar3,&local_41,&local_68,&local_69);
  std::__cxx11::string::~string((string *)&local_68);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         *)&__range1);
  __end1 = std::
           map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(mapping);
  si = (pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)std::
          map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::end(mapping);
  while( true ) {
    bVar2 = std::operator!=(&__end1,(_Self *)&si);
    if (!bVar2) break;
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*(&__end1);
    objectNameLower.field_2._8_8_ = ppVar4->first;
    psVar3 = cmSourceFile::GetFullPath_abi_cxx11_((cmSourceFile *)objectNameLower.field_2._8_8_);
    cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_138,psVar3);
    cmsys::SystemTools::LowerCase(&local_118,&local_138);
    cmGlobalGenerator::GetLanguageOutputExtension_abi_cxx11_
              ((string *)&__range1_1,(this->super_cmLocalGenerator).GlobalGenerator,
               (cmSourceFile *)objectNameLower.field_2._8_8_);
    cmStrCat<std::__cxx11::string,std::__cxx11::string>
              ((string *)local_f8,&local_118,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1_1);
    std::__cxx11::string::~string((string *)&__range1_1);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           *)&__range1,(key_type *)local_f8);
    *pmVar5 = *pmVar5 + 1;
    std::__cxx11::string::~string((string *)local_f8);
    std::
    _Rb_tree_iterator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(mapping);
  si_1 = (pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)std::
            map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::end(mapping);
  while( true ) {
    bVar2 = std::operator!=(&__end1_1,(_Self *)&si_1);
    if (!bVar2) break;
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*(&__end1_1);
    objectName.field_2._8_8_ = ppVar4->first;
    psVar3 = cmSourceFile::GetFullPath_abi_cxx11_((cmSourceFile *)objectName.field_2._8_8_);
    cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_1c0,psVar3);
    cmGlobalGenerator::GetLanguageOutputExtension_abi_cxx11_
              (&local_1e0,(this->super_cmLocalGenerator).GlobalGenerator,
               (cmSourceFile *)objectName.field_2._8_8_);
    cmStrCat<std::__cxx11::string,std::__cxx11::string>((string *)local_1a0,&local_1c0,&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_1c0);
    cmsys::SystemTools::LowerCase((string *)local_200,(string *)local_1a0);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           *)&__range1,(key_type *)local_200);
    iVar1 = *pmVar5;
    std::__cxx11::string::~string((string *)local_200);
    if (1 < iVar1) {
      cmGeneratorTarget::AddExplicitObjectName
                ((cmGeneratorTarget *)dir_max.field_2._8_8_,(cmSourceFile *)objectName.field_2._8_8_
                );
      cmLocalGenerator::GetObjectFileNameWithoutTarget
                (&local_228,&this->super_cmLocalGenerator,(cmSourceFile *)objectName.field_2._8_8_,
                 (string *)local_40,&local_201,(char *)0x0);
      std::__cxx11::string::operator=((string *)local_1a0,(string *)&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      cmsys::SystemTools::ReplaceString((string *)local_1a0,"/","_");
    }
    std::__cxx11::string::operator=((string *)&ppVar4->second,(string *)local_1a0);
    std::__cxx11::string::~string((string *)local_1a0);
    std::
    _Rb_tree_iterator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end1_1);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *)&__range1);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmLocalGhsMultiGenerator::ComputeObjectFilenames(
  std::map<cmSourceFile const*, std::string>& mapping,
  cmGeneratorTarget const* gt)
{
  std::string dir_max = cmStrCat(this->GetCurrentBinaryDirectory(), '/',
                                 this->GetTargetDirectory(gt), '/');

  // Count the number of object files with each name.  Note that
  // filesystem may not be case sensitive.
  std::map<std::string, int> counts;

  for (auto const& si : mapping) {
    cmSourceFile const* sf = si.first;
    std::string objectNameLower = cmStrCat(
      cmSystemTools::LowerCase(
        cmSystemTools::GetFilenameWithoutLastExtension(sf->GetFullPath())),
      this->GlobalGenerator->GetLanguageOutputExtension(*sf));
    counts[objectNameLower] += 1;
  }

  // For all source files producing duplicate names we need unique
  // object name computation.
  for (auto& si : mapping) {
    cmSourceFile const* sf = si.first;
    std::string objectName = cmStrCat(
      cmSystemTools::GetFilenameWithoutLastExtension(sf->GetFullPath()),
      this->GlobalGenerator->GetLanguageOutputExtension(*sf));

    if (counts[cmSystemTools::LowerCase(objectName)] > 1) {
      const_cast<cmGeneratorTarget*>(gt)->AddExplicitObjectName(sf);
      bool keptSourceExtension;
      objectName = this->GetObjectFileNameWithoutTarget(*sf, dir_max,
                                                        &keptSourceExtension);
      cmsys::SystemTools::ReplaceString(objectName, "/", "_");
    }
    si.second = objectName;
  }
}